

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

bool __thiscall testing::internal::FilePath::CreateDirectoriesRecursively(FilePath *this)

{
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  FilePath parent;
  FilePath local_60;
  FilePath local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = (this->pathname_)._M_string_length;
  if ((sVar1 == 0) || ((this->pathname_)._M_dataplus._M_p[sVar1 - 1] != '/')) {
    bVar3 = false;
  }
  else {
    bVar2 = DirectoryExists(this);
    bVar3 = true;
    if (!bVar2) {
      RemoveTrailingPathSeparator(&local_60,this);
      RemoveFileName(&local_40,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      bVar3 = CreateDirectoriesRecursively(&local_40);
      if (bVar3) {
        bVar3 = CreateFolder(this);
      }
      else {
        bVar3 = false;
      }
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool FilePath::CreateDirectoriesRecursively() const {
  if (!this->IsDirectory()) {
    return false;
  }

  if (pathname_.length() == 0 || this->DirectoryExists()) {
    return true;
  }

  const FilePath parent(this->RemoveTrailingPathSeparator().RemoveFileName());
  return parent.CreateDirectoriesRecursively() && this->CreateFolder();
}